

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  __n = (this->tokenizer_).current_.text._M_string_length;
  if (__n == value->_M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(value->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_002f28bf;
    }
    io::Tokenizer::Next(&this->tokenizer_);
    bVar1 = true;
  }
  else {
LAB_002f28bf:
    std::operator+(&local_a8,"Expected \"",value);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar3[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
      local_48 = (long *)*plVar3;
    }
    local_40 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_48,
                                (ulong)(this->tokenizer_).current_.text._M_dataplus._M_p);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar4;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88.field_2._8_8_ = plVar3[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_88._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Consume(const std::string& value) {
    const std::string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError("Expected \"" + value + "\", found \"" + current_value +
                  "\".");
      return false;
    }

    tokenizer_.Next();

    return true;
  }